

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestNpn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint fDumpRes;
  char *pcVar5;
  uint fBinary;
  uint fVerbose;
  uint local_38;
  uint local_34;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  local_34 = 0xffffffff;
  local_38 = 0;
  fDumpRes = 0;
  fBinary = 0;
LAB_002253fb:
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"ANdbvh"), iVar1 = globalUtilOptind, iVar2 == 0x62)
      {
        fBinary = fBinary ^ 1;
      }
      if (iVar2 == -1) {
        if (globalUtilOptind + 1 == argc) {
          if (5 < local_34) {
            Abc_NpnTest(argv[globalUtilOptind],local_38,local_34,fDumpRes,fBinary,fVerbose);
            return 0;
          }
          pcVar4 = "The number of variables cannot be less than 6.\n";
        }
        else {
          pcVar4 = "Input file is not given.\n";
        }
        Abc_Print(1,pcVar4);
        return 0;
      }
      if (iVar2 != 0x76) break;
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00225530:
        Abc_Print(-1,pcVar4);
        goto LAB_0022553a;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_34 = uVar3;
    }
    else {
      if (iVar2 == 100) {
        fDumpRes = fDumpRes ^ 1;
        goto LAB_002253fb;
      }
      if (iVar2 != 0x41) goto LAB_0022553a;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_00225530;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_38 = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_0022553a:
      Abc_Print(-2,"usage: testnpn [-AN <num>] [-dbvh] <file>\n");
      Abc_Print(-2,"\t           testbench for computing (semi-)canonical forms\n");
      Abc_Print(-2,"\t           of completely-specified Boolean functions up to 16 varibles\n");
      Abc_Print(-2,"\t-A <num> : semi-caninical form computation algorithm [default = %d]\n",
                (ulong)local_38);
      Abc_Print(-2,"\t               0: uniqifying truth tables\n");
      Abc_Print(-2,"\t               1: exact NPN canonical form by brute-force enumeration\n");
      Abc_Print(-2,"\t               2: semi-canonical form by counting 1s in cofactors\n");
      Abc_Print(-2,"\t               3: Jake\'s hybrid semi-canonical form (fast)\n");
      Abc_Print(-2,"\t               4: Jake\'s hybrid semi-canonical form (high-effort)\n");
      Abc_Print(-2,"\t               5: new fast hybrid semi-canonical form\n");
      Abc_Print(-2,"\t               6: new phase canonical form\n");
      Abc_Print(-2,"\t               7: new hierarchical matching\n");
      Abc_Print(-2,
                "\t               8: hierarchical matching            by XueGong Zhou at Fudan University, Shanghai\n"
               );
      Abc_Print(-2,
                "\t               9: adjustable algorithm (heuristic) by XueGong Zhou at Fudan University, Shanghai\n"
               );
      Abc_Print(-2,
                "\t              10: adjustable algorithm (exact)     by XueGong Zhou at Fudan University, Shanghai\n"
               );
      Abc_Print(-2,
                "\t              11: new cost-aware exact algorithm   by XueGong Zhou at Fudan University, Shanghai\n"
               );
      Abc_Print(-2,
                "\t-N <num> : the number of support variables (binary files only) [default = unused]\n"
               );
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (fDumpRes == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d       : toggle dumping resulting functions into a file [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (fBinary == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-b       : toggle dumping in binary format [default = %s]\n",pcVar4);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,
                "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n")
      ;
      Abc_Print(-2,"\t           or a binary file with an array of truth tables (in this case,\n");
      Abc_Print(-2,"\t           -N <num> is required to determine how many functions are stored)\n"
               );
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTestNpn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NpnTest( char * pFileName, int NpnType, int nVarNum, int fDumpRes, int fBinary, int fVerbose );
    char * pFileName;
    int c;
    int fVerbose = 0;
    int NpnType = 0;
    int nVarNum = -1;
    int fDumpRes = 0;
    int fBinary = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ANdbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            NpnType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( NpnType < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVarNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVarNum < 0 )
                goto usage;
            break;
        case 'd':
            fDumpRes ^= 1;
            break;
        case 'b':
            fBinary ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( 1,"Input file is not given.\n" );
        return 0;
    }
    if ( nVarNum >= 0 && nVarNum < 6 )
    {
        Abc_Print( 1,"The number of variables cannot be less than 6.\n" );
        return 0;
    }
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the testbench
    Abc_NpnTest( pFileName, NpnType, nVarNum, fDumpRes, fBinary, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: testnpn [-AN <num>] [-dbvh] <file>\n" );
    Abc_Print( -2, "\t           testbench for computing (semi-)canonical forms\n" );
    Abc_Print( -2, "\t           of completely-specified Boolean functions up to 16 varibles\n" );
    Abc_Print( -2, "\t-A <num> : semi-caninical form computation algorithm [default = %d]\n", NpnType );
    Abc_Print( -2, "\t               0: uniqifying truth tables\n" );
    Abc_Print( -2, "\t               1: exact NPN canonical form by brute-force enumeration\n" );
    Abc_Print( -2, "\t               2: semi-canonical form by counting 1s in cofactors\n" );
    Abc_Print( -2, "\t               3: Jake's hybrid semi-canonical form (fast)\n" );
    Abc_Print( -2, "\t               4: Jake's hybrid semi-canonical form (high-effort)\n" );
    Abc_Print( -2, "\t               5: new fast hybrid semi-canonical form\n" );
    Abc_Print( -2, "\t               6: new phase canonical form\n" );
    Abc_Print( -2, "\t               7: new hierarchical matching\n" );
    Abc_Print( -2, "\t               8: hierarchical matching            by XueGong Zhou at Fudan University, Shanghai\n" );
    Abc_Print( -2, "\t               9: adjustable algorithm (heuristic) by XueGong Zhou at Fudan University, Shanghai\n" );
    Abc_Print( -2, "\t              10: adjustable algorithm (exact)     by XueGong Zhou at Fudan University, Shanghai\n" );
    Abc_Print( -2, "\t              11: new cost-aware exact algorithm   by XueGong Zhou at Fudan University, Shanghai\n" );
    Abc_Print( -2, "\t-N <num> : the number of support variables (binary files only) [default = unused]\n" );
    Abc_Print( -2, "\t-d       : toggle dumping resulting functions into a file [default = %s]\n", fDumpRes? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggle dumping in binary format [default = %s]\n", fBinary? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
    Abc_Print( -2, "\t           or a binary file with an array of truth tables (in this case,\n");
    Abc_Print( -2, "\t           -N <num> is required to determine how many functions are stored)\n");
    return 1;
}